

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void fejer1_compute(int n,double *x,double *w)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FEJER1_COMPUTE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  N < 1.\n");
    exit(1);
  }
  uVar6 = (ulong)(uint)n;
  if (n == 1) {
    *x = 0.0;
    *w = 2.0;
    return;
  }
  pvVar2 = operator_new__(uVar6 * 8);
  iVar1 = n * 2 + -1;
  for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    *(double *)((long)pvVar2 + uVar3 * 8) = ((double)iVar1 * 3.141592653589793) / (double)(n * 2);
    iVar1 = iVar1 + -2;
  }
  for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    dVar7 = cos(*(double *)((long)pvVar2 + uVar3 * 8));
    x[uVar3] = dVar7;
  }
  for (uVar3 = 0; uVar3 != uVar6; uVar3 = uVar3 + 1) {
    w[uVar3] = 1.0;
    uVar4 = 2;
    iVar1 = 4;
    dVar7 = 1.0;
    for (iVar5 = 1; iVar5 - ((uint)n >> 1) != 1; iVar5 = iVar5 + 1) {
      dVar8 = cos((double)uVar4 * *(double *)((long)pvVar2 + uVar3 * 8));
      dVar7 = dVar7 - (dVar8 + dVar8) / (double)(iVar1 * iVar5 + -1);
      w[uVar3] = dVar7;
      iVar1 = iVar1 + 4;
      uVar4 = uVar4 + 2;
    }
  }
  for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    w[uVar3] = (w[uVar3] + w[uVar3]) / (double)n;
  }
  operator_delete__(pvVar2);
  return;
}

Assistant:

void fejer1_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEJER1_COMPUTE computes a Fejer type 1 quadrature rule.
//
//  Discussion:
//
//    This method uses a direct approach.  The paper by Waldvogel
//    exhibits a more efficient approach using Fourier transforms.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 March 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//    Walter Gautschi,
//    Numerical Quadrature in the Presence of a Singularity,
//    SIAM Journal on Numerical Analysis,
//    Volume 4, Number 3, 1967, pages 357-362.
//
//    Joerg Waldvogel,
//    Fast Construction of the Fejer and Clenshaw-Curtis Quadrature Rules,
//    BIT Numerical Mathematics,
//    Volume 43, Number 1, 2003, pages 1-18.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  int j;
  const double r8_pi = 3.141592653589793;
  double *theta;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "FEJER1_COMPUTE - Fatal error!\n";
    std::cerr << "  N < 1.\n";
    exit ( 1 );
  }

  if ( n == 1 )
  {
    x[0] = 0.0;
    w[0] = 2.0;
    return;
  }

  theta = new double[n];

  for ( i = 1; i <= n; i++ )
  {
    theta[i-1] = double( 2 * ( n - i ) + 1 ) * r8_pi
               / double( 2 * n     );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = cos ( theta[i] );
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 1.0;
    for ( j = 1; j <= ( n / 2 ); j++ )
    {
      w[i] = w[i] - 2.0
        * cos ( 2.0 * double( j ) * theta[i] ) 
        / double( 4 * j * j - 1 );
    }
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 2.0 * w[i] / double( n );
  }

  delete [] theta;

  return;
}